

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

void __thiscall r_exec::Group::update(Group *this,uint64_t planned_time)

{
  atomic_int_fast64_t *paVar1;
  pointer ppOVar2;
  Operation *pOVar3;
  long *plVar4;
  pointer ppCVar5;
  Controller *pCVar6;
  _Object *p_Var7;
  View *pVVar8;
  bool bVar9;
  char cVar10;
  byte bVar11;
  ushort uVar12;
  int iVar13;
  _Mem *p_Var14;
  Group *pGVar15;
  ulong uVar16;
  _Rb_tree_node_base *p_Var17;
  TimeJob *j;
  uint64_t uVar18;
  UpdateJob *this_00;
  long lVar19;
  pointer ppCVar20;
  pthread_mutex_t *__mutex;
  pointer ppOVar21;
  undefined4 uVar22;
  float fVar23;
  double dVar24;
  uint8_t selector;
  const_iterator v;
  GroupState state;
  const_iterator end;
  uint8_t local_91;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_90;
  pthread_mutex_t *local_88;
  double local_80;
  long local_78;
  double local_70;
  double local_68;
  GroupState local_60;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  double local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_38;
  
  __mutex = (pthread_mutex_t *)&this->mutex;
  iVar13 = pthread_mutex_lock(__mutex);
  if (iVar13 != 0) {
    std::__throw_system_error(iVar13);
  }
  p_Var14 = (_Mem *)r_code::Mem::Get();
  pGVar15 = (Group *)_Mem::get_root(p_Var14);
  if ((pGVar15 == this) ||
     ((this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      views._M_h._M_element_count != 0)) {
    local_88 = __mutex;
    local_78 = (*Now)();
    std::
    _Rb_tree<core::P<r_exec::View>,_core::P<r_exec::View>,_std::_Identity<core::P<r_exec::View>_>,_r_code::View::Less,_std::allocator<core::P<r_exec::View>_>_>
    ::clear(&(this->newly_salient_views)._M_t);
    ppOVar21 = (this->pending_operations).
               super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (this->pending_operations).
              super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppOVar21 == ppOVar2) break;
      pOVar3 = *ppOVar21;
      (*pOVar3->_vptr_Operation[2])(pOVar3,this);
      (*pOVar3->_vptr_Operation[1])(pOVar3);
      ppOVar21 = ppOVar21 + 1;
    }
    ppOVar21 = (this->pending_operations).
               super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pending_operations).
        super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
        _M_impl.super__Vector_impl_data._M_finish != ppOVar21) {
      (this->pending_operations).
      super__Vector_base<r_exec::Group::Operation_*,_std::allocator<r_exec::Group::Operation_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = ppOVar21;
    }
    update_sln_thr(this);
    update_act_thr(this);
    update_vis_thr(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,2);
    uVar22 = r_code::Atom::asFloat();
    local_80 = (double)CONCAT44(local_80._4_4_,uVar22);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,7);
    uVar22 = r_code::Atom::asFloat();
    local_70 = (double)CONCAT44(local_70._4_4_,uVar22);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,8);
    local_44 = (float)r_code::Atom::asFloat();
    local_40 = update_c_act(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,8);
    local_48 = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,5);
    local_4c = (float)r_code::Atom::asFloat();
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    local_50 = (float)r_code::Atom::asFloat();
    local_68 = update_c_sln(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,6);
    fVar23 = (float)r_code::Atom::asFloat();
    local_60.was_c_active = local_44 < local_70._0_4_;
    local_70 = (double)local_48;
    local_60.is_c_active = local_70 < local_40;
    local_60.former_sln_thr = (double)local_80._0_4_;
    local_60.was_c_salient = local_50 < local_4c;
    local_80 = (double)fVar23;
    local_60.is_c_salient = local_80 < local_68;
    reset_stats(this);
    local_90._M_cur = (__node_type *)(this->ipgm_views)._M_h._M_before_begin._M_nxt;
    local_38._M_cur = (__node_type *)0x0;
    local_91 = '\0';
    bVar9 = all_views_cond(this,&local_91,(const_iterator *)&local_90,(const_iterator *)&local_38);
    if (bVar9) {
      do {
        cVar10 = (**(code **)(**(long **)(*(long *)((long)&((local_90._M_cur)->
                                                                                                                      
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8) + 0x20) + 0x70))();
        if (cVar10 == '\0') {
          lVar19 = *(long *)((long)&((local_90._M_cur)->
                                    super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                    ._M_storage._M_storage + 8);
          uVar12 = r_code::Atom::asIndex();
          uVar16 = r_code::Utils::GetTimestamp((Atom *)(lVar19 + 0x28 + (ulong)uVar12 * 4));
          if (uVar16 < planned_time) {
            dVar24 = update_res(this,*(View **)((long)&((local_90._M_cur)->
                                                                                                              
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8));
            pVVar8 = *(View **)((long)&((local_90._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                       ._M_storage._M_storage + 8);
            if (dVar24 <= 0.0) {
              r_exec::View::delete_from_object(pVVar8);
              delete_view(this,(const_iterator *)&local_90);
            }
            else {
              _update_saliency(this,&local_60,pVVar8);
              plVar4 = *(long **)(*(long *)((long)&((local_90._M_cur)->
                                                                                                      
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8) + 0x20);
              (**(code **)(*plVar4 + 0x20))(plVar4,0);
              bVar11 = r_code::Atom::getDescriptor();
              if (bVar11 - 0xc9 < 7) {
                _update_activation(this,&local_60,
                                   *(View **)((long)&((local_90._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8));
              }
              else if (bVar11 == 200) {
                _update_visibility(this,&local_60,
                                   *(View **)((long)&((local_90._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8));
              }
              local_90._M_cur = (__node_type *)((local_90._M_cur)->super__Hash_node_base)._M_nxt;
            }
          }
          else {
            local_90._M_cur = (__node_type *)((local_90._M_cur)->super__Hash_node_base)._M_nxt;
          }
        }
        else {
          delete_view(this,(const_iterator *)&local_90);
        }
        bVar9 = all_views_cond(this,&local_91,(const_iterator *)&local_90,
                               (const_iterator *)&local_38);
      } while (bVar9);
    }
    if (local_80 < local_68) {
      cov(this);
    }
    __mutex = local_88;
    for (p_Var17 = (this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var17 !=
        &(this->newly_salient_views)._M_t._M_impl.super__Rb_tree_header;
        p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17)) {
      inject_reduction_jobs(this,*(View **)(p_Var17 + 1));
    }
    if ((local_70 < local_40) && (local_80 < local_68)) {
      ppCVar5 = (this->new_controllers).
                super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar20 = (this->new_controllers).
                      super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppCVar20 != ppCVar5;
          ppCVar20 = ppCVar20 + 1) {
        pCVar6 = *ppCVar20;
        p_Var7 = (pCVar6->view->object).object;
        (*p_Var7->_vptr__Object[4])(p_Var7,0);
        cVar10 = r_code::Atom::getDescriptor();
        if (cVar10 == -0x35) {
          j = (TimeJob *)operator_new(0x28);
          pVVar8 = (View *)pCVar6->view;
          uVar18 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(pVVar8->super_View).object.object,4);
          InputLessPGMSignalingJob::InputLessPGMSignalingJob
                    ((InputLessPGMSignalingJob *)j,pVVar8,uVar18 + local_78);
          LOCK();
          paVar1 = &(j->super__Object).refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          p_Var14 = (_Mem *)r_code::Mem::Get();
          _Mem::pushTimeJob(p_Var14,j);
LAB_0016ef0f:
          LOCK();
          paVar1 = &(j->super__Object).refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
          UNLOCK();
          if ((j->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
            (*(j->super__Object)._vptr__Object[1])(j);
          }
        }
        else if (cVar10 == -0x34) {
          j = (TimeJob *)operator_new(0x28);
          pVVar8 = (View *)pCVar6->view;
          uVar18 = r_code::Utils::GetTimestamp<r_code::Code>
                             ((Code *)(pVVar8->super_View).object.object,4);
          AntiPGMSignalingJob::AntiPGMSignalingJob
                    ((AntiPGMSignalingJob *)j,pVVar8,uVar18 + local_78);
          LOCK();
          paVar1 = &(j->super__Object).refCount;
          (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
          UNLOCK();
          p_Var14 = (_Mem *)r_code::Mem::Get();
          _Mem::pushTimeJob(p_Var14,j);
          goto LAB_0016ef0f;
        }
      }
      ppCVar20 = (this->new_controllers).
                 super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      __mutex = local_88;
      if ((this->new_controllers).
          super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppCVar20) {
        (this->new_controllers).
        super__Vector_base<r_exec::Controller_*,_std::allocator<r_exec::Controller_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppCVar20;
      }
    }
    update_stats(this);
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[5])(this,1);
    fVar23 = (float)r_code::Atom::asFloat();
    if ((int)(long)fVar23 != 0) {
      p_Var14 = (_Mem *)r_code::Mem::Get();
      this_00 = (UpdateJob *)operator_new(0x28);
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[5])(this,1);
      uVar22 = r_code::Atom::asFloat();
      local_78 = CONCAT44(local_78._4_4_,uVar22);
      lVar19 = r_code::Utils::GetBasePeriod();
      UpdateJob::UpdateJob
                (this_00,this,lVar19 * ((long)(float)local_78 & 0xffffffffU) + planned_time);
      _Mem::pushTimeJob(p_Var14,(TimeJob *)this_00);
    }
  }
  else {
    (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
      super__Object._vptr__Object[0xf])(this);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void Group::update(uint64_t planned_time)
{
    std::lock_guard<std::mutex> guard(mutex);

    if (this != _Mem::Get()->get_root() && views.size() == 0) {
        invalidate();
        return;
    }

    uint64_t now = Now();
    //if(get_secondary_group()!=NULL)
    // std::cout<<Utils::RelativeTime(Now())<<" UPR\n";
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ----------------------------------------------------------------\n";
    newly_salient_views.clear();

    // execute pending operations.
    for (Operation *pending_operation : pending_operations) {
        pending_operation->execute(this);
        delete pending_operation;
    }

    pending_operations.clear();
    // update group's ctrl values.
    update_sln_thr(); // applies decay on sln thr.
    update_act_thr();
    update_vis_thr();
    GroupState state(get_sln_thr(), get_c_act() > get_c_act_thr(), update_c_act() > get_c_act_thr(), get_c_sln() > get_c_sln_thr(), update_c_sln() > get_c_sln_thr());
    reset_stats();
    FOR_ALL_VIEWS_BEGIN_NO_INC(this, v)

    if (v->second->object->is_invalidated()) { // no need to update the view set.
        delete_view(v);
    } else {
        uint64_t ijt = v->second->get_ijt();

        if (ijt >= planned_time) { // in case the update happens later than planned, don't touch views that were injected after the planned update time: update next time.
            ++v;
            continue;
        }

        double res = update_res(v->second); // update resilience: decrement res by 1 in addition to the accumulated changes.

        if (res > 0) {
            _update_saliency(&state, v->second); // apply decay.

            switch (v->second->object->code(0).getDescriptor()) {
            case Atom::GROUP:
                _update_visibility(&state, v->second);
                break;

            case Atom::NULL_PROGRAM:
            case Atom::INSTANTIATED_PROGRAM:
            case Atom::INSTANTIATED_ANTI_PROGRAM:
            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            case Atom::INSTANTIATED_CPP_PROGRAM:
            case Atom::COMPOSITE_STATE:
            case Atom::MODEL:
                _update_activation(&state, v->second);
                break;
            }

            ++v;
        } else { // view has no resilience: delete it from the group.
            v->second->delete_from_object();
            delete_view(v);
        }
    }

    FOR_ALL_VIEWS_END

    if (state.is_c_salient) {
        cov();
    }

    // build reduction jobs.
    std::multiset<P<View>, r_code::View::Less>::const_iterator v;

    for (v = newly_salient_views.begin(); v != newly_salient_views.end(); ++v) {
        inject_reduction_jobs(*v);
    }

    if (state.is_c_active && state.is_c_salient) { // build signaling jobs for new ipgms.
        for (Controller *new_controller : new_controllers) {
            switch (new_controller->getObject()->code(0).getDescriptor()) {
            case Atom::INSTANTIATED_ANTI_PROGRAM: { // inject signaling jobs for |ipgm (tsc).
                P<TimeJob> j = new AntiPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }

            case Atom::INSTANTIATED_INPUT_LESS_PROGRAM: { // inject a signaling job for an input-less pgm.
                P<TimeJob> j = new InputLessPGMSignalingJob(new_controller->getView(), now + Utils::GetTimestamp<Code>(new_controller->getObject(), IPGM_TSC));
                _Mem::Get()->pushTimeJob(j);
                break;
            }
            }
        }

        new_controllers.clear();
    }

    update_stats(); // triggers notifications.

    if (get_upr() > 0) { // inject the next update job for the group.
        _Mem::Get()->pushTimeJob(new UpdateJob(this, planned_time + get_upr()*Utils::GetBasePeriod()));
    }

    //if(get_secondary_group()!=NULL)
    //if(this==_Mem::Get()->get_stdin())
    // std::cout<<Utils::RelativeTime(Now())<<" ++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++++\n";
}